

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

int docast(void)

{
  boolean bVar1;
  int local_10;
  int local_c;
  int spell_no;
  
  bVar1 = getspell(&local_10);
  if (bVar1 == '\0') {
    local_c = 0;
  }
  else {
    local_c = spelleffects(local_10,'\0');
  }
  return local_c;
}

Assistant:

int docast(void)
{
	int spell_no;

	if (getspell(&spell_no))
	    return spelleffects(spell_no, FALSE);
	return 0;
}